

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

obj * mkcorpstat(int objtype,monst *mtmp,permonst *ptr,level *lev,int x,int y,boolean init)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  obj *poVar4;
  int old_corpsenm;
  obj *otmp2;
  obj *otmp;
  int y_local;
  int x_local;
  level *lev_local;
  permonst *ptr_local;
  monst *mtmp_local;
  int objtype_local;
  
  if ((objtype != 0x10e) && (objtype != 0x215)) {
    warning("making corpstat type %d",(ulong)(uint)objtype);
  }
  if ((x == 0) && (y == 0)) {
    otmp2 = mksobj(lev,objtype,init,'\0');
    if (otmp2 != (obj *)0x0) {
      rloco(otmp2);
    }
  }
  else {
    otmp2 = mksobj_at(objtype,lev,x,y,init,'\0');
  }
  if (otmp2 != (obj *)0x0) {
    lev_local = (level *)ptr;
    if (mtmp != (monst *)0x0) {
      if (ptr == (permonst *)0x0) {
        lev_local = (level *)mtmp->data;
      }
      poVar4 = save_mtraits(otmp2,mtmp);
      if (poVar4 != (obj *)0x0) {
        otmp2 = poVar4;
      }
    }
    if (lev_local != (level *)0x0) {
      iVar1 = otmp2->corpsenm;
      iVar2 = monsndx((permonst *)lev_local);
      otmp2->corpsenm = iVar2;
      uVar3 = weight(otmp2);
      otmp2->owt = uVar3;
      if ((otmp2->otyp == 0x10e) &&
         (((((((iVar1 == 0x154 || (iVar1 == 0xa3)) || (((long)iVar1 & 0x3ffffffffffffffU) == 0x144))
             || ((((long)iVar1 & 0x3ffffffffffffffU) == 0x146 ||
                 (((long)iVar1 & 0x3ffffffffffffffU) == 0x145)))) ||
            ((mons[iVar1].mlet == '4' &&
             ((((long)iVar1 & 0x3ffffffffffffffU) != 0xfd &&
              (((long)iVar1 & 0x3ffffffffffffffU) != 0xfe)))))) || (mons[iVar1].mlet == '.')) ||
          (((((otmp2->corpsenm == 0x154 || (otmp2->corpsenm == 0xa3)) ||
             (((long)otmp2->corpsenm & 0x3ffffffffffffffU) == 0x144)) ||
            (((((long)otmp2->corpsenm & 0x3ffffffffffffffU) == 0x146 ||
              (((long)otmp2->corpsenm & 0x3ffffffffffffffU) == 0x145)) ||
             ((mons[otmp2->corpsenm].mlet == '4' &&
              ((((long)otmp2->corpsenm & 0x3ffffffffffffffU) != 0xfd &&
               (((long)otmp2->corpsenm & 0x3ffffffffffffffU) != 0xfe)))))))) ||
           (mons[otmp2->corpsenm].mlet == '.')))))) {
        obj_stop_timers(otmp2);
        start_corpse_timeout(otmp2);
      }
    }
  }
  return otmp2;
}

Assistant:

struct obj *mkcorpstat(int objtype,	/* CORPSE or STATUE */
		       struct monst *mtmp,
		       const struct permonst *ptr,
		       struct level *lev,
		       int x, int y,
		       boolean init)
{
	struct obj *otmp;

	if (objtype != CORPSE && objtype != STATUE)
	    warning("making corpstat type %d", objtype);
	if (x == 0 && y == 0) {		/* special case - random placement */
		otmp = mksobj(lev, objtype, init, FALSE);
		if (otmp) rloco(otmp);
	} else
		otmp = mksobj_at(objtype, lev, x, y, init, FALSE);
	if (otmp) {
	    if (mtmp) {
		struct obj *otmp2;

		if (!ptr) ptr = mtmp->data;
		/* save_mtraits frees original data pointed to by otmp */
		otmp2 = save_mtraits(otmp, mtmp);
		if (otmp2) otmp = otmp2;
	    }
	    /* use the corpse or statue produced by mksobj() as-is
	       unless `ptr' is non-null */
	    if (ptr) {
		int old_corpsenm = otmp->corpsenm;

		otmp->corpsenm = monsndx(ptr);
		otmp->owt = weight(otmp);
		if (otmp->otyp == CORPSE &&
			(special_corpse(old_corpsenm) ||
				special_corpse(otmp->corpsenm))) {
		    obj_stop_timers(otmp);
		    start_corpse_timeout(otmp);
		}
	    }
	}
	return otmp;
}